

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::InternalRecord::Unserialize<AutoFile>(InternalRecord *this,AutoFile *s)

{
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj;
  uint32_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->unused = (uint8_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_num = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->records = local_24;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&this->data,(ulong)(this->m_header).len);
  pbVar3 = (this->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  AutoFile::read(s,(int)pbVar3,
                 (this->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish + -(long)pbVar3,in_RCX);
  if ((this->m_header).other_endian == true) {
    uVar1 = this->page_num;
    uVar2 = this->records;
    this->page_num = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    this->records = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused;
        s >> page_num;
        s >> records;

        data.resize(m_header.len);
        s.read(AsWritableBytes(Span(data.data(), data.size())));

        if (m_header.other_endian) {
            page_num = internal_bswap_32(page_num);
            records = internal_bswap_32(records);
        }
    }